

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

bool init::StartLogging(ArgsManager *args)

{
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  bool bVar1;
  byte bVar2;
  undefined1 uVar3;
  Logger *pLVar4;
  ArgsManager *in_RDI;
  long in_FS_OFFSET;
  path config_file_path;
  undefined4 in_stack_fffffffffffffba8;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffbac;
  char *in_stack_fffffffffffffbb0;
  undefined8 in_stack_fffffffffffffbb8;
  char *in_stack_fffffffffffffbc0;
  undefined6 in_stack_fffffffffffffbc8;
  undefined1 in_stack_fffffffffffffbce;
  undefined1 in_stack_fffffffffffffbcf;
  bilingual_str *in_stack_fffffffffffffbd0;
  string *in_stack_fffffffffffffbe0;
  undefined7 in_stack_fffffffffffffbe8;
  undefined1 in_stack_fffffffffffffbef;
  char *in_stack_fffffffffffffbf0;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbf8;
  ConstevalStringLiteral str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc00;
  undefined7 in_stack_fffffffffffffc08;
  undefined1 in_stack_fffffffffffffc0f;
  LogFlags in_stack_fffffffffffffc10;
  undefined8 in_stack_fffffffffffffc18;
  int source_line;
  ArgsManager *in_stack_fffffffffffffc28;
  Logger *in_stack_fffffffffffffc48;
  ConstevalFormatString<1U> in_stack_fffffffffffffc58;
  char *fmt;
  ConstevalFormatString<1U> fmt_00;
  size_t in_stack_fffffffffffffc60;
  char *this;
  ArgsManager *pAVar6;
  ArgsManager *in_stack_fffffffffffffc68;
  size_t in_stack_fffffffffffffc70;
  Logger *in_stack_fffffffffffffc78;
  undefined7 in_stack_fffffffffffffc88;
  undefined1 in_stack_fffffffffffffc8f;
  allocator<char> local_349 [135];
  allocator<char> local_2c2;
  allocator<char> local_2c1 [17];
  Level in_stack_fffffffffffffd50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd60;
  undefined1 local_1c0 [448];
  
  source_line = (int)((ulong)in_stack_fffffffffffffc18 >> 0x20);
  uVar3 = (undefined1)((ulong)in_stack_fffffffffffffbb8 >> 0x38);
  local_1c0._440_8_ = *(long *)(in_FS_OFFSET + 0x28);
  pLVar4 = LogInstance();
  if ((pLVar4->m_print_to_file & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8));
    in_stack_fffffffffffffc28 = (ArgsManager *)LogInstance();
    BCLog::Logger::DefaultShrinkDebugFile
              ((Logger *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    bVar1 = ArgsManager::GetBoolArg
                      ((ArgsManager *)in_stack_fffffffffffffbb0,
                       (string *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                       (bool)uVar3);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    std::allocator<char>::~allocator(local_2c1);
    if (bVar1) {
      LogInstance();
      BCLog::Logger::ShrinkDebugFile(in_stack_fffffffffffffc48);
    }
  }
  LogInstance();
  bVar1 = BCLog::Logger::StartLogging(in_stack_fffffffffffffc78);
  if (bVar1) {
    pLVar4 = LogInstance();
    if ((pLVar4->m_log_timestamps & 1U) == 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT17(in_stack_fffffffffffffbcf,
                          CONCAT16(in_stack_fffffffffffffbce,in_stack_fffffffffffffbc8)),
                 in_stack_fffffffffffffbc0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT17(in_stack_fffffffffffffbcf,
                          CONCAT16(in_stack_fffffffffffffbce,in_stack_fffffffffffffbc8)),
                 in_stack_fffffffffffffbc0);
      in_stack_fffffffffffffbb0 = "Startup time: %s\n";
      GetTime();
      in_stack_fffffffffffffc00 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1c0 + 0xb8);
      FormatISO8601DateTime_abi_cxx11_
                (CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
      uVar5 = 2;
      logging_function._M_str = (char *)in_stack_fffffffffffffc78;
      logging_function._M_len = in_stack_fffffffffffffc70;
      source_file._M_str = in_stack_fffffffffffffbb0;
      source_file._M_len = in_stack_fffffffffffffc60;
      in_stack_fffffffffffffc68 = (ArgsManager *)in_stack_fffffffffffffbb0;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function,source_file,source_line,in_stack_fffffffffffffc10,
                 in_stack_fffffffffffffd50,in_stack_fffffffffffffc58,in_stack_fffffffffffffd60);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffbac,uVar5));
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_fffffffffffffbcf,
                        CONCAT16(in_stack_fffffffffffffbce,in_stack_fffffffffffffbc8)),
               in_stack_fffffffffffffbc0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_fffffffffffffbcf,
                        CONCAT16(in_stack_fffffffffffffbce,in_stack_fffffffffffffbc8)),
               in_stack_fffffffffffffbc0);
    this = "Default data directory %s\n";
    str.lit = local_1c0 + 0x70;
    GetDefaultDataDir();
    fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffffbb0);
    uVar5 = 2;
    logging_function_00._M_str = (char *)in_stack_fffffffffffffc78;
    logging_function_00._M_len = in_stack_fffffffffffffc70;
    source_file_00._M_str = (char *)in_stack_fffffffffffffc68;
    source_file_00._M_len = (size_t)this;
    pAVar6 = (ArgsManager *)this;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function_00,source_file_00,source_line,in_stack_fffffffffffffc10,
               in_stack_fffffffffffffd50,in_stack_fffffffffffffc58,in_stack_fffffffffffffd60);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffbac,uVar5));
    fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffbac,uVar5));
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_fffffffffffffbcf,
                        CONCAT16(in_stack_fffffffffffffbce,in_stack_fffffffffffffbc8)),
               in_stack_fffffffffffffbc0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_fffffffffffffbcf,
                        CONCAT16(in_stack_fffffffffffffbce,in_stack_fffffffffffffbc8)),
               in_stack_fffffffffffffbc0);
    fmt = "Using data directory %s\n";
    __s = local_1c0 + 0x28;
    ArgsManager::GetDataDirNet((ArgsManager *)this);
    fs::PathToString_abi_cxx11_((path *)this);
    uVar5 = 2;
    logging_function_01._M_str = (char *)in_stack_fffffffffffffc78;
    logging_function_01._M_len = in_stack_fffffffffffffc70;
    source_file_01._M_str = (char *)in_stack_fffffffffffffc68;
    source_file_01._M_len = (size_t)pAVar6;
    fmt_00.fmt = fmt;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function_01,source_file_01,source_line,in_stack_fffffffffffffc10,
               in_stack_fffffffffffffd50,(ConstevalFormatString<1U>)fmt,in_stack_fffffffffffffd60);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffbac,uVar5));
    fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffbac,uVar5));
    ArgsManager::GetConfigFilePath((ArgsManager *)local_1c0);
    uVar3 = fs::exists((path *)CONCAT44(in_stack_fffffffffffffbac,uVar5));
    if ((bool)uVar3) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT17(in_stack_fffffffffffffbcf,
                          CONCAT16(in_stack_fffffffffffffbce,in_stack_fffffffffffffbc8)),
                 in_stack_fffffffffffffbc0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT17(in_stack_fffffffffffffbcf,
                          CONCAT16(in_stack_fffffffffffffbce,in_stack_fffffffffffffbc8)),
                 in_stack_fffffffffffffbc0);
      fs::PathToString_abi_cxx11_((path *)fmt);
      uVar5 = 2;
      logging_function_02._M_str = (char *)in_stack_fffffffffffffc78;
      logging_function_02._M_len = in_stack_fffffffffffffc70;
      source_file_02._M_str = (char *)in_stack_fffffffffffffc68;
      source_file_02._M_len = (size_t)pAVar6;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function_02,source_file_02,source_line,in_stack_fffffffffffffc10,
                 in_stack_fffffffffffffd50,fmt_00,in_stack_fffffffffffffd60);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffbac,uVar5));
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)str.lit,__s,
                 (allocator<char> *)CONCAT17(uVar3,in_stack_fffffffffffffbe8));
      bVar2 = ArgsManager::IsArgSet
                        (in_RDI,(string *)
                                CONCAT17(in_stack_fffffffffffffbcf,
                                         CONCAT16(in_stack_fffffffffffffbce,
                                                  in_stack_fffffffffffffbc8)));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffbac,uVar5));
      std::allocator<char>::~allocator(local_349);
      if ((bVar2 & 1) == 0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffbce,in_stack_fffffffffffffbc8)),
                   in_stack_fffffffffffffbc0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffbce,in_stack_fffffffffffffbc8)),
                   in_stack_fffffffffffffbc0);
        fs::PathToString_abi_cxx11_((path *)fmt);
        uVar5 = 2;
        logging_function_03._M_str = (char *)in_stack_fffffffffffffc78;
        logging_function_03._M_len = in_stack_fffffffffffffc70;
        source_file_03._M_str = (char *)in_stack_fffffffffffffc68;
        source_file_03._M_len = (size_t)pAVar6;
        LogPrintFormatInternal<std::__cxx11::string>
                  (logging_function_03,source_file_03,source_line,in_stack_fffffffffffffc10,
                   in_stack_fffffffffffffd50,fmt_00,in_stack_fffffffffffffd60);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffbac,uVar5));
      }
      else {
        ::_(str);
        fs::PathToString_abi_cxx11_((path *)fmt);
        tinyformat::format<std::__cxx11::string>
                  ((bilingual_str *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08),
                   in_stack_fffffffffffffc00);
        InitWarning((bilingual_str *)in_RDI);
        bilingual_str::~bilingual_str((bilingual_str *)CONCAT44(in_stack_fffffffffffffbac,uVar5));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffbac,uVar5));
        bilingual_str::~bilingual_str((bilingual_str *)CONCAT44(in_stack_fffffffffffffbac,uVar5));
      }
    }
    ArgsManager::LogArgs(in_stack_fffffffffffffc28);
    bVar2 = 1;
    fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffbac,uVar5));
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8));
    Untranslated(in_stack_fffffffffffffbe0);
    LogInstance();
    fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffffbb0);
    tinyformat::format<std::__cxx11::string>
              ((bilingual_str *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08),
               in_stack_fffffffffffffc00);
    bVar2 = InitError(in_stack_fffffffffffffbd0);
    bilingual_str::~bilingual_str
              ((bilingual_str *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    bilingual_str::~bilingual_str
              ((bilingual_str *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    std::allocator<char>::~allocator(&local_2c2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_1c0._440_8_) {
    __stack_chk_fail();
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool StartLogging(const ArgsManager& args)
{
    if (LogInstance().m_print_to_file) {
        if (args.GetBoolArg("-shrinkdebugfile", LogInstance().DefaultShrinkDebugFile())) {
            // Do this first since it both loads a bunch of debug.log into memory,
            // and because this needs to happen before any other debug.log printing
            LogInstance().ShrinkDebugFile();
        }
    }
    if (!LogInstance().StartLogging()) {
            return InitError(strprintf(Untranslated("Could not open debug log file %s"),
                fs::PathToString(LogInstance().m_file_path)));
    }

    if (!LogInstance().m_log_timestamps)
        LogPrintf("Startup time: %s\n", FormatISO8601DateTime(GetTime()));
    LogPrintf("Default data directory %s\n", fs::PathToString(GetDefaultDataDir()));
    LogPrintf("Using data directory %s\n", fs::PathToString(gArgs.GetDataDirNet()));

    // Only log conf file usage message if conf file actually exists.
    fs::path config_file_path = args.GetConfigFilePath();
    if (fs::exists(config_file_path)) {
        LogPrintf("Config file: %s\n", fs::PathToString(config_file_path));
    } else if (args.IsArgSet("-conf")) {
        // Warn if no conf file exists at path provided by user
        InitWarning(strprintf(_("The specified config file %s does not exist"), fs::PathToString(config_file_path)));
    } else {
        // Not categorizing as "Warning" because it's the default behavior
        LogPrintf("Config file: %s (not found, skipping)\n", fs::PathToString(config_file_path));
    }

    // Log the config arguments to debug.log
    args.LogArgs();

    return true;
}